

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O2

int * es::init::singleton<int,_es::init::early_initializer,_void,_std::ios_base::Init>::
      first_time_get_instance(void)

{
  int iVar1;
  ostream *poVar2;
  logic_error *this;
  Init init_object;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::ios_base::Init::Init(&init_object);
  if ((_ZN2es4initL14clean_up_phaseE_0 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: initializing at clean up phase - ");
    poVar2 = std::operator<<(poVar2,
                             "static T &es::init::singleton<int>::first_time_get_instance() [T = int, EI = es::init::early_initializer, M = void, InitT = std::ios_base::Init]"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if (singleton_meta_data_node._p == (void *)0x0) {
    if (((byte)singleton_meta_data_node._flags & 1) != 0) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Error: circular dependency ",&local_59);
      std::operator+(&local_38,&local_58,
                     "static T &es::init::singleton<int>::first_time_get_instance() [T = int, EI = es::init::early_initializer, M = void, InitT = std::ios_base::Init]"
                    );
      std::logic_error::logic_error(this,(string *)&local_38);
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    tc_spin_lock::lock(&singleton_meta_data_node._lock);
    if (singleton_meta_data_node._p == (void *)0x0) {
      if (singleton_meta_data_node._init_count != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Warning: 1 first_time_get_instance: initializing Singleton, more than once: init_count: "
                                );
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2," - ");
        poVar2 = std::operator<<(poVar2,
                                 "static T &es::init::singleton<int>::first_time_get_instance() [T = int, EI = es::init::early_initializer, M = void, InitT = std::ios_base::Init]"
                                );
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = operator<<(poVar2,&singleton_meta_data_node);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      singleton_meta_data_node._flags._0_1_ = (byte)singleton_meta_data_node._flags | 1;
      if (singleton<int,es::init::early_initializer,void,std::ios_base::Init>::
          first_time_get_instance()::iCounter == '\0') {
        iVar1 = __cxa_guard_acquire(&singleton<int,es::init::early_initializer,void,std::ios_base::Init>
                                     ::first_time_get_instance()::iCounter);
        if (iVar1 != 0) {
          LOCK();
          details_static_instances_counting::global_static_instances_counter =
               details_static_instances_counting::global_static_instances_counter + 1;
          UNLOCK();
          __cxa_atexit(details_static_instances_counting::
                       InstancesCounterZeroActivated<es::init::ActionOnZero>::
                       ~InstancesCounterZeroActivated,
                       &singleton<int,es::init::early_initializer,void,std::ios_base::Init>::
                        first_time_get_instance()::iCounter,&__dso_handle);
          __cxa_guard_release(&singleton<int,es::init::early_initializer,void,std::ios_base::Init>::
                               first_time_get_instance()::iCounter);
        }
      }
      _u._instance = 0;
      singleton_meta_data_node._func = active_delete;
      singleton_meta_data_node._p = &_u;
      singleton_meta_data_node._func_name =
           "static T &es::init::singleton<int>::first_time_get_instance() [T = int, EI = es::init::early_initializer, M = void, InitT = std::ios_base::Init]"
      ;
      singleton_meta_data_node._init_count = singleton_meta_data_node._init_count + 1;
      static_obj_stack<es::init::singletons_meta_data>::push(&singleton_meta_data_node);
      singleton_meta_data_node._flags._0_1_ = (byte)singleton_meta_data_node._flags & 0xfe;
    }
    LOCK();
    singleton_meta_data_node._lock._spinlock = false;
    UNLOCK();
  }
  LOCK();
  _get_instance._M_b._M_p = (__base_type)optimized_get_instance;
  UNLOCK();
  std::ios_base::Init::~Init(&init_object);
  return (int *)&_u;
}

Assistant:

static T& first_time_get_instance()
    {
        InitT init_object{};  // make sure, one can use the std::cout std::cerr streams from Singletons code

        if constexpr (es::init::verbose_singletons)
        {
            std::cerr << "Info: firstTimeGetInstance: initializing Singleton: " << __PRETTY_FUNCTION__ << " "
                      << singleton_meta_data_node << std::endl;
        }

        if (clean_up_phase)
        {
            std::cerr << "Warning: initializing at clean up phase - " << __PRETTY_FUNCTION__ << std::endl;
        }

        if (!singleton_meta_data_node._p)
        {
            if (singleton_meta_data_node._flags & 0x1U)
            {
                throw std::logic_error(std::string{"Error: circular dependency "} + __PRETTY_FUNCTION__);
            }
            std::lock_guard<tc_spin_lock> guard(singleton_meta_data_node._lock);

            if (!singleton_meta_data_node._p)
            {
                if (singleton_meta_data_node._init_count > 0)
                {
                    std::cerr
                        << "Warning: 1 first_time_get_instance: initializing Singleton, more than once: init_count: "
                        << singleton_meta_data_node._init_count << " - " << __PRETTY_FUNCTION__ << " "
                        << singleton_meta_data_node << std::endl;
                }

                singleton_meta_data_node._flags |= 0x1U;
                static details_static_instances_counting::InstancesCounterZeroActivated<ActionOnZero> iCounter{};
                new (&_u._instance) T{};

                if constexpr (es::init::verbose_singletons)
                {
                    if (singleton_meta_data_node._init_count > 0)
                        std::cerr << "Warning: 2 first_time_get_instance: initializing Singleton, more than once: "
                                     "init_count: "
                                  << singleton_meta_data_node._init_count << " - " << __PRETTY_FUNCTION__ << " "
                                  << singleton_meta_data_node << std::endl;
                }

                singleton_meta_data_node._func      = active_delete;
                singleton_meta_data_node._p         = (void*)&_u._instance;
                singleton_meta_data_node._func_name = __PRETTY_FUNCTION__;
                singleton_meta_data_node._init_count++;
                stack::push(&singleton_meta_data_node);
                singleton_meta_data_node._flags &= ~0x1U;
            }
        }
        _get_instance = optimized_get_instance;

        return _u._instance;
    }